

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume.cpp
# Opt level: O0

bool __thiscall GT5VolumeFile::parseHeader(GT5VolumeFile *this,uint8_t *header,uint64_t headerSize)

{
  bool bVar1;
  undefined1 uVar2;
  uint uVar3;
  uint uVar4;
  VolumeFile *this_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in;
  uint64_t *fileSize_00;
  reference pvVar5;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  basic_ostream<char,_std::char_traits<char>_> *this_02;
  VolumeFile *in_RDI;
  value_type *streamDesc;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  char titleId [128];
  unsigned_long fileSize;
  unsigned_long unk;
  uint dataSize;
  uint zDataSize;
  uint seed;
  uint magic;
  unsigned_long headerSizeAligned;
  uint8_t *p;
  unsigned_long *in_stack_fffffffffffffd98;
  basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffda0;
  undefined7 in_stack_fffffffffffffda8;
  undefined1 in_stack_fffffffffffffdaf;
  VolumeFile *in_stack_fffffffffffffdb0;
  VolumeFile *in_stack_fffffffffffffdb8;
  undefined7 in_stack_fffffffffffffdc0;
  ifstream *stream;
  undefined7 in_stack_fffffffffffffde8;
  uint local_200;
  uint local_1fc;
  undefined1 local_f0 [168];
  VolumeFile *local_48;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  undefined8 local_30;
  byte local_1;
  
  local_30 = 0x800;
  bVar1 = VolumeFile::needSwapEndian(in_RDI);
  if (bVar1) {
    uVar3 = readNextWithByteSwap<unsigned_int,unsigned_char>((uchar **)in_stack_fffffffffffffda0);
  }
  else {
    uVar3 = readNext<unsigned_int,unsigned_char>((uchar **)in_stack_fffffffffffffda0);
  }
  if (uVar3 == 0x5b745162) {
    local_34 = uVar3;
    bVar1 = VolumeFile::needSwapEndian(in_RDI);
    if (bVar1) {
      uVar4 = readNextWithByteSwap<unsigned_int,unsigned_char>((uchar **)in_stack_fffffffffffffda0);
    }
    else {
      uVar4 = readNext<unsigned_int,unsigned_char>((uchar **)in_stack_fffffffffffffda0);
    }
    local_38 = uVar4;
    bVar1 = VolumeFile::needSwapEndian(in_RDI);
    if (bVar1) {
      local_1fc = readNextWithByteSwap<unsigned_int,unsigned_char>
                            ((uchar **)in_stack_fffffffffffffda0);
    }
    else {
      local_1fc = readNext<unsigned_int,unsigned_char>((uchar **)in_stack_fffffffffffffda0);
    }
    local_3c = local_1fc;
    bVar1 = VolumeFile::needSwapEndian(in_RDI);
    if (bVar1) {
      local_200 = readNextWithByteSwap<unsigned_int,unsigned_char>
                            ((uchar **)in_stack_fffffffffffffda0);
    }
    else {
      local_200 = readNext<unsigned_int,unsigned_char>((uchar **)in_stack_fffffffffffffda0);
    }
    local_40 = local_200;
    bVar1 = VolumeFile::needSwapEndian(in_RDI);
    if (bVar1) {
      this_00 = (VolumeFile *)
                readNextWithByteSwap<unsigned_long,unsigned_char>
                          ((uchar **)in_stack_fffffffffffffda0);
    }
    else {
      this_00 = (VolumeFile *)
                readNext<unsigned_long,unsigned_char>((uchar **)in_stack_fffffffffffffda0);
    }
    local_48 = this_00;
    bVar1 = VolumeFile::needSwapEndian(in_RDI);
    if (bVar1) {
      in = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
           readNextWithByteSwap<unsigned_long,unsigned_char>((uchar **)in_stack_fffffffffffffda0);
    }
    else {
      in = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
           readNext<unsigned_long,unsigned_char>((uchar **)in_stack_fffffffffffffda0);
    }
    local_f0._160_8_ = in;
    readNextN<char,unsigned_char>
              ((uchar **)in_stack_fffffffffffffda0,(char *)in_stack_fffffffffffffd98,0x133f9e);
    std::__cxx11::string::operator=((string *)(in_RDI + 1),local_f0 + 0x18);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x133fc6);
    uVar2 = VolumeFile::readDataAt
                      (in_stack_fffffffffffffdb0,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
                       (uint64_t)in_stack_fffffffffffffda0,(uint64_t)in_stack_fffffffffffffd98);
    if ((bool)uVar2) {
      stream = (ifstream *)local_f0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x134036);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)stream);
      VolumeFile::decryptData
                (in_stack_fffffffffffffdb8,(uint8_t *)in_stack_fffffffffffffdb0,
                 CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8),
                 (uint32_t)((ulong)in_stack_fffffffffffffda0 >> 0x20));
      uVar2 = VolumeFile::inflateDataIfNeeded(this_00,in,CONCAT17(uVar2,in_stack_fffffffffffffde8));
      if ((bool)uVar2) {
        fileSize_00 = (uint64_t *)alignUp<unsigned_long>((ulong)local_3c + 0x800,0x800);
        in_RDI->m_dataOffset = (uint64_t)fileSize_00;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::swap
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffdb0,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   CONCAT17(in_stack_fffffffffffffdaf,in_stack_fffffffffffffda8));
        std::vector<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_>::emplace_back<>
                  ((vector<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_> *)
                   in_stack_fffffffffffffda0);
        pvVar5 = std::vector<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_>::back
                           ((vector<VolumeFile::StreamDesc,_std::allocator<VolumeFile::StreamDesc>_>
                             *)in_stack_fffffffffffffda0);
        in_stack_fffffffffffffdb0 =
             (VolumeFile *)boost::filesystem::path::string_abi_cxx11_(&in_RDI->m_origPath);
        std::__cxx11::string::operator=
                  ((string *)&pvVar5->filePath,(string *)in_stack_fffffffffffffdb0);
        bVar1 = prepareStream(stream,(string *)CONCAT17(uVar2,in_stack_fffffffffffffdc0),fileSize_00
                             );
        if (bVar1) {
          boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::basic_format
                    ((basic_format<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
                     (char *)CONCAT44(uVar3,uVar4));
          this_01 = boost::basic_format<char,std::char_traits<char>,std::allocator<char>>::operator%
                              (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
          this_02 = boost::operator<<((basic_ostream<char,_std::char_traits<char>_> *)in_RDI,
                                      (basic_format<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)CONCAT44(uVar3,uVar4));
          std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
          boost::basic_format<char,_std::char_traits<char>,_std::allocator<char>_>::~basic_format
                    (this_01);
          local_1 = 1;
        }
        else {
          local_1 = 0;
        }
      }
      else {
        local_1 = 0;
      }
    }
    else {
      local_1 = 0;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffdb0);
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool GT5VolumeFile::parseHeader(const uint8_t* header, uint64_t headerSize)
{
	const auto* p = header;

	const auto headerSizeAligned = SEGMENT_SIZE;

	const auto magic = VOLUME_READ_NEXT_SELF(p, uint32_t);
	if (magic != HEADER_MAGIC) {
		return false;
	}

	const auto seed = VOLUME_READ_NEXT_SELF(p, uint32_t); // TODO: segment index actually?
	const auto zDataSize = VOLUME_READ_NEXT_SELF(p, uint32_t); // with header
	const auto dataSize = VOLUME_READ_NEXT_SELF(p, uint32_t);
	const auto unk = VOLUME_READ_NEXT_SELF(p, uint64_t);
	const auto fileSize = VOLUME_READ_NEXT_SELF(p, uint64_t);
	UNUSED(fileSize);

	char titleId[128];
	VOLUME_READN_NEXT_SELF(p, char, titleId, sizeof(titleId));
	m_titleId = titleId;

	std::vector<uint8_t> data;
	if (!readDataAt(data, headerSizeAligned, zDataSize)) {
		return false;
	}
	decryptData(data.data(), data.size(), seed);
	if (!inflateDataIfNeeded(data, dataSize)) {
		return false;
	}

	m_dataOffset = alignUp(headerSizeAligned + zDataSize, SEGMENT_SIZE);
	m_data.swap(data);

	m_dataStreams.emplace_back();
	auto& streamDesc = m_dataStreams.back();
	{
		streamDesc.filePath = m_origPath.string();
		if (!prepareStream(streamDesc.stream, streamDesc.filePath, &streamDesc.fileSize)) {
			return false;
		}
		std::cout << boost::format("Data file size: %1%") % streamDesc.fileSize << std::endl;
	}

	return true;
}